

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  aom_img_fmt_t fmt;
  int iVar3;
  _Bool _Var4;
  byte bVar5;
  uint16_t uVar6;
  int iVar7;
  uint d_w;
  uint d_h;
  uint uVar8;
  uint uVar9;
  int iVar10;
  aom_codec_err_t aVar11;
  aom_image_t *paVar12;
  FILE *__stream;
  uint8_t *flat_blocks;
  FILE *__stream_00;
  FILE *__stream_01;
  ulong uVar13;
  long lVar14;
  FILE *__s;
  int iVar15;
  char **argv_00;
  size_t size;
  ulong uVar16;
  int iVar17;
  double *__filename;
  int iVar18;
  char *pcVar19;
  int iVar20;
  long lVar21;
  int c;
  double *pdVar22;
  long lVar23;
  ulong uVar24;
  int k;
  long lVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  aom_noise_model_params_t params;
  size_t sStack_9c0;
  aom_img_fmt_t local_9b0;
  double *local_9a8;
  aom_rational local_9a0;
  double *local_998;
  ulong local_980;
  int local_970;
  int local_96c;
  ulong local_960;
  double *local_940;
  int strides [3];
  aom_film_grain_table_t grain_table;
  int local_8d8 [2];
  undefined4 local_8d0;
  uchar *local_8c8;
  uchar *puStack_8c0;
  uchar *local_8b8;
  uchar *local_8a8;
  uchar *puStack_8a0;
  uchar *local_898;
  aom_image_t raw;
  aom_flat_block_finder_t block_finder;
  aom_image_t denoised;
  aom_noise_model_t noise_model;
  aom_film_grain_t grain;
  aom_internal_error_info error_info;
  
  exec_name = *argv;
  local_9a8 = (double *)0x0;
  local_9b0 = AOM_IMG_FMT_I420;
  uVar24 = 0x20;
  uVar9 = 8;
  local_9a0.num = 0x19;
  local_9a0.den = 0;
  local_970 = 1;
  local_980 = 1;
  local_940 = (double *)0x0;
  local_998 = (double *)0x0;
  d_h = 0;
  d_w = 0;
  __filename = (double *)0x0;
  local_96c = local_970;
  for (argv_00 = argv + 1; *argv_00 != (char *)0x0; argv_00 = argv_00 + 1) {
    iVar7 = arg_match((arg *)&noise_model,&help,argv_00);
    if (iVar7 != 0) {
      fwrite("\nOptions:\n",10,1,_stdout);
LAB_0011f768:
      arg_show_usage((FILE *)_stdout,(arg_def **)parse_args_main_args);
      exit(0);
    }
    iVar7 = arg_match((arg *)&noise_model,&width_arg,argv_00);
    pdVar22 = __filename;
    if (iVar7 == 0) {
      iVar7 = arg_match((arg *)&noise_model,&height_arg,argv_00);
      if (iVar7 == 0) {
        iVar7 = arg_match((arg *)&noise_model,&input_arg,argv_00);
        pdVar22 = noise_model.combined_state[0].eqns.A;
        if (iVar7 == 0) {
          iVar7 = arg_match((arg *)&noise_model,&input_denoised_arg,argv_00);
          if (iVar7 == 0) {
            iVar7 = arg_match((arg *)&noise_model,&output_grain_table_arg,argv_00);
            if (iVar7 == 0) {
              iVar7 = arg_match((arg *)&noise_model,&block_size_arg,argv_00);
              if (iVar7 == 0) {
                iVar7 = arg_match((arg *)&noise_model,&bit_depth_arg,argv_00);
                if (iVar7 == 0) {
                  iVar7 = arg_match((arg *)&noise_model,&flat_block_finder_arg,argv_00);
                  if (iVar7 == 0) {
                    iVar7 = arg_match((arg *)&noise_model,&fps_arg,argv_00);
                    if (iVar7 == 0) {
                      iVar7 = arg_match((arg *)&noise_model,&use_i420,argv_00);
                      if (iVar7 == 0) {
                        iVar7 = arg_match((arg *)&noise_model,&use_i422,argv_00);
                        if (iVar7 == 0) {
                          iVar7 = arg_match((arg *)&noise_model,&use_i444,argv_00);
                          if (iVar7 == 0) {
                            iVar7 = arg_match((arg *)&noise_model,&skip_frames_arg,argv_00);
                            if (iVar7 == 0) {
                              iVar7 = arg_match((arg *)&noise_model,&debug_file_arg,argv_00);
                              if (iVar7 == 0) {
                                fprintf(_stdout,"Unknown arg: %s\n\nUsage:\n",*argv_00);
                                goto LAB_0011f768;
                              }
                              local_9a8 = noise_model.combined_state[0].eqns.A;
                              pdVar22 = __filename;
                            }
                            else {
                              local_96c = atoi((char *)noise_model.combined_state[0].eqns.A);
                              pdVar22 = __filename;
                            }
                          }
                          else {
                            local_9b0 = AOM_IMG_FMT_I444;
                            pdVar22 = __filename;
                          }
                        }
                        else {
                          local_9b0 = AOM_IMG_FMT_I422;
                          pdVar22 = __filename;
                        }
                      }
                      else {
                        local_9b0 = AOM_IMG_FMT_I420;
                        pdVar22 = __filename;
                      }
                    }
                    else {
                      local_9a0 = arg_parse_rational((arg *)&noise_model);
                      local_980 = (ulong)local_9a0 >> 0x20;
                      pdVar22 = __filename;
                    }
                  }
                  else {
                    local_970 = atoi((char *)noise_model.combined_state[0].eqns.A);
                    pdVar22 = __filename;
                  }
                }
                else {
                  uVar9 = atoi((char *)noise_model.combined_state[0].eqns.A);
                  pdVar22 = __filename;
                }
              }
              else {
                uVar8 = atoi((char *)noise_model.combined_state[0].eqns.A);
                uVar24 = (ulong)uVar8;
                pdVar22 = __filename;
              }
            }
            else {
              local_940 = noise_model.combined_state[0].eqns.A;
              pdVar22 = __filename;
            }
          }
          else {
            local_998 = noise_model.combined_state[0].eqns.A;
            pdVar22 = __filename;
          }
        }
      }
      else {
        d_h = atoi((char *)noise_model.combined_state[0].eqns.A);
      }
    }
    else {
      d_w = atoi((char *)noise_model.combined_state[0].eqns.A);
    }
    __filename = pdVar22;
  }
  fmt = local_9b0 | 0x800;
  if ((int)uVar9 < 9) {
    fmt = local_9b0;
  }
  if (((((int)d_w < 1) || ((int)d_h < 1)) || ((d_w & 1) != 0)) || ((d_h & 1) != 0)) {
    die("Invalid frame size: %dx%d",(ulong)d_w,(ulong)d_h);
  }
  paVar12 = aom_img_alloc(&raw,fmt,d_w,d_h,1);
  if ((paVar12 == (aom_image_t *)0x0) ||
     (paVar12 = aom_img_alloc(&denoised,fmt,d_w,d_h,1), paVar12 == (aom_image_t *)0x0)) {
    pcVar19 = "Failed to allocate image.";
  }
  else {
    __stream = fopen64((char *)__filename,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar19 = "Failed to open input file: %s";
LAB_0011f7b0:
      die(pcVar19,__filename);
    }
    bVar1 = 8 < (int)uVar9;
    fprintf(_stderr,"Bit depth: %d  stride:%d\n",(ulong)uVar9,(ulong)(uint)raw.stride[0]);
    iVar7 = (int)uVar24;
    aom_flat_block_finder_init(&block_finder,iVar7,uVar9,(uint)bVar1);
    size = (size_t)(((int)(iVar7 + d_h + -1) / iVar7) * ((int)(iVar7 + d_w + -1) / iVar7));
    flat_blocks = (uint8_t *)aom_malloc(size);
    if (flat_blocks == (uint8_t *)0x0) {
      pcVar19 = "Failed to allocate block data.";
    }
    else {
      params.use_highbd._0_1_ = 8 < (int)uVar9;
      params.bit_depth = uVar9;
      params.use_highbd._1_3_ = 0;
      params.shape = '\x01';
      params._1_3_ = 0;
      params.lag = 3;
      aom_noise_model_init(&noise_model,params);
      if (local_998 == (double *)0x0) {
        pcVar19 = "--input-denoised file must be specified";
      }
      else {
        __stream_00 = fopen64((char *)local_998,"rb");
        if (__stream_00 == (FILE *)0x0) {
          pcVar19 = "Unable to open input_denoised: %s";
          __filename = local_998;
          goto LAB_0011f7b0;
        }
        if (local_9a8 == (double *)0x0) {
          __stream_01 = (FILE *)0x0;
        }
        else {
          __stream_01 = fopen64((char *)local_9a8,"w");
        }
        grain_table.head = (aom_film_grain_table_entry_t *)0x0;
        grain_table.tail = (aom_film_grain_table_entry_t *)0x0;
        dVar2 = (double)(iVar7 * iVar7);
        iVar17 = 0;
        if (0 < iVar7) {
          iVar17 = iVar7;
        }
        uVar6 = 0x1cdf;
        uVar16 = 0;
        local_960 = 0;
        while (_Var4 = aom_img_read(&raw,(FILE *)__stream), _Var4) {
          _Var4 = aom_img_read(&denoised,(FILE *)__stream_00);
          if (!_Var4) {
            pcVar19 = "Unable to read input denoised file";
            goto LAB_0011f78b;
          }
          if ((int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff) %
                   (long)local_96c) == 0) {
            memset(flat_blocks,1,size);
            if (local_970 != 0) {
              memset(flat_blocks,0,size);
              uVar9 = aom_flat_block_finder_run(&block_finder,raw.planes[0],d_w,d_h,d_w,flat_blocks)
              ;
              fprintf(_stdout,"Num flat blocks %d\n",(ulong)uVar9);
            }
            local_8a8 = raw.planes[0];
            puStack_8a0 = raw.planes[1];
            local_898 = raw.planes[2];
            local_8c8 = denoised.planes[0];
            puStack_8c0 = denoised.planes[1];
            strides[0] = raw.stride[0] >> bVar1;
            local_8b8 = denoised.planes[2];
            strides[1] = raw.stride[1] >> bVar1;
            strides[2] = raw.stride[2] >> bVar1;
            local_8d8[0] = raw.x_chroma_shift;
            local_8d8[1] = raw.y_chroma_shift;
            local_8d0 = 0;
            fwrite("Updating noise model...\n",0x18,1,_stdout);
            bVar5 = aom_noise_model_update
                              (&noise_model,&local_8a8,&local_8c8,d_w,d_h,strides,local_8d8,
                               flat_blocks,iVar7);
            if (bVar5 == 3) {
              uVar13 = ((long)(int)local_980 * 10000000 * uVar16) / (ulong)(long)local_9a0.num;
              fprintf(_stdout,"Noise type is different, updating parameters for time [ %ld, %ld)\n",
                      local_960,uVar13);
              aom_noise_model_get_grain_parameters(&noise_model,&grain);
              grain.random_seed = uVar6;
              aom_film_grain_table_append(&grain_table,local_960,uVar13,&grain);
              aom_noise_model_save_latest(&noise_model);
              uVar6 = 0;
              local_960 = uVar13;
            }
            if (__stream_01 != (FILE *)0x0) {
              fwrite("figure(3); clf;\n",0x10,1,__stream_01);
              fwrite("figure(2); clf;\n",0x10,1,__stream_01);
              fwrite("figure(1); clf;\n",0x10,1,__stream_01);
              for (uVar13 = 0; uVar13 != 3; uVar13 = uVar13 + 1) {
                fprintf(__stream_01,"noise_strength_%d = [\n",uVar13 & 0xffffffff);
                for (lVar25 = 0; lVar25 < noise_model.combined_state[uVar13].strength_solver.eqns.n;
                    lVar25 = lVar25 + 1) {
                  fprintf(__stream_01,"%lf ",
                          SUB84(noise_model.combined_state[uVar13].strength_solver.eqns.x[lVar25],0)
                         );
                }
                fwrite("];\n",3,1,__stream_01);
                fprintf(__stream_01,"plot(noise_strength_%d); hold on;\n",uVar13 & 0xffffffff);
              }
              fwrite("legend(\'Y\', \'cb\', \'cr\');\n",0x19,1,__stream_01);
              fwrite("title(\'Noise strength function\');\n",0x22,1,__stream_01);
              aom_noise_model_get_grain_parameters(&noise_model,&grain);
              grain.apply_grain = 1;
              grain.random_seed = 0x1cdf;
              grain.bit_depth = raw.bit_depth;
              aom_img_alloc((aom_image_t *)&error_info,raw.fmt,raw.w,raw.h,1);
              iVar10 = av1_add_film_grain(&grain,&denoised,(aom_image_t *)&error_info);
              if (iVar10 == 0) {
                uVar9 = raw.w + iVar7 + -1;
                iVar10 = 0;
                uVar8 = raw.h + iVar7 + -1;
                fwrite("x = [",5,1,__stream_01);
                lVar25 = (long)(int)(uVar9 / uVar24);
                for (lVar14 = 0; lVar14 < (int)(uVar8 / uVar24); lVar14 = lVar14 + 1) {
                  iVar15 = 0;
                  for (lVar23 = 0; lVar23 < lVar25; lVar23 = lVar23 + 1) {
                    iVar18 = iVar10 * raw.stride[0] + iVar15;
                    dVar26 = 0.0;
                    dVar30 = 0.0;
                    dVar31 = 0.0;
                    dVar27 = 0.0;
                    dVar29 = 0.0;
                    for (iVar20 = 0; uVar13 = uVar24, iVar3 = iVar18, iVar20 != iVar17;
                        iVar20 = iVar20 + 1) {
                      while ((int)uVar13 != 0) {
                        lVar21 = (long)iVar3;
                        dVar28 = (double)(int)((uint)raw.planes[0][lVar21] -
                                              (uint)denoised.planes[0][lVar21]);
                        dVar26 = dVar26 + dVar28;
                        dVar27 = dVar27 + dVar28 * dVar28;
                        dVar29 = dVar29 + (double)raw.planes[0][lVar21];
                        dVar28 = (double)(int)((uint)*(byte *)(error_info.detail._56_8_ + lVar21) -
                                              (uint)denoised.planes[0][lVar21]);
                        dVar31 = dVar31 + dVar28;
                        dVar30 = dVar30 + dVar28 * dVar28;
                        uVar13 = (ulong)((int)uVar13 - 1);
                        iVar3 = iVar3 + 1;
                      }
                      iVar18 = iVar18 + raw.stride[0];
                    }
                    dVar27 = dVar27 / dVar2 - (dVar26 / dVar2) * (dVar26 / dVar2);
                    if (dVar27 < 0.0) {
                      dVar27 = sqrt(dVar27);
                    }
                    else {
                      dVar27 = SQRT(dVar27);
                    }
                    dVar26 = dVar30 / dVar2 - (dVar31 / dVar2) * (dVar31 / dVar2);
                    if (dVar26 < 0.0) {
                      dVar26 = sqrt(dVar26);
                    }
                    else {
                      dVar26 = SQRT(dVar26);
                    }
                    fprintf(__stream_01,"%d %3.2lf %3.2lf %3.2lf  ",SUB84(dVar29 / dVar2,0),dVar27,
                            dVar26,(ulong)flat_blocks[lVar23 + lVar14 * lVar25]);
                    iVar15 = iVar15 + iVar7;
                  }
                  fputc(10,__stream_01);
                  iVar10 = iVar10 + iVar7;
                }
                fwrite("];\n",3,1,__stream_01);
                if ((raw.fmt & 0x800) == AOM_IMG_FMT_NONE) {
                  fwrite("figure(2); clf;\n",0x10,1,__stream_01);
                  fwrite("scatter(x(:, 2:4:end), x(:, 3:4:end), \'r\'); hold on;\n",0x35,1,
                         __stream_01);
                  fwrite("scatter(x(:, 2:4:end), x(:, 4:4:end), \'b\');\n",0x2c,1,__stream_01);
                  fwrite("plot(linspace(0, 255, length(noise_strength_0)), noise_strength_0, \'b\');\n"
                         ,0x49,1,__stream_01);
                  fwrite("title(\'Scatter plot of intensity vs noise strength\');\n",0x36,1,
                         __stream_01);
                  fwrite("legend(\'Actual\', \'Estimated\', \'Estimated strength\');\n",0x35,1,
                         __stream_01);
                  fwrite("figure(3); clf;\n",0x10,1,__stream_01);
                  fwrite("scatter(x(:, 3:4:end), x(:, 4:4:end), \'k\');\n",0x2c,1,__stream_01);
                  fwrite("title(\'Actual vs Estimated\');\n",0x1e,1,__stream_01);
                  pcVar19 = "pause(3);\n";
                  sStack_9c0 = 10;
                  __s = __stream_01;
                }
                else {
                  pcVar19 = "Detailed debug info not supported for high bitdepth formats\n";
                  sStack_9c0 = 0x3c;
                  __s = _stderr;
                }
                fwrite(pcVar19,sStack_9c0,1,__s);
              }
              else {
                fwrite("Internal failure in av1_add_film_grain().\n",0x2a,1,_stderr);
              }
              aom_img_free((aom_image_t *)&error_info);
              fflush(__stream_01);
            }
            fprintf(_stdout,"Done noise model update, status = %d\n",(ulong)bVar5);
          }
          uVar16 = uVar16 + 1;
        }
        aom_noise_model_get_grain_parameters(&noise_model,&grain);
        grain.random_seed = uVar6;
        aom_film_grain_table_append(&grain_table,local_960,0x7fffffffffffffff,&grain);
        if ((local_940 == (double *)0x0) ||
           (aVar11 = aom_film_grain_table_write(&grain_table,(char *)local_940,&error_info),
           aVar11 == AOM_CODEC_OK)) {
          aom_film_grain_table_free(&grain_table);
          fclose(__stream);
          fclose(__stream_00);
          if (__stream_01 != (FILE *)0x0) {
            fclose(__stream_01);
          }
          aom_img_free(&raw);
          aom_img_free(&denoised);
          return 0;
        }
        pcVar19 = "Unable to write output film grain table";
      }
    }
  }
LAB_0011f78b:
  die(pcVar19);
}

Assistant:

int main(int argc, char *argv[]) {
  noise_model_args_t args = { 0,  0, { 25, 1 }, 0, 0, 0,   AOM_IMG_FMT_I420,
                              32, 8, 1,         0, 1, NULL };
  aom_image_t raw, denoised;
  FILE *infile = NULL;
  AvxVideoInfo info;

  memset(&info, 0, sizeof(info));

  (void)argc;
  exec_name = argv[0];
  parse_args(&args, argv + 1);

  info.frame_width = args.width;
  info.frame_height = args.height;
  info.time_base.numerator = args.fps.den;
  info.time_base.denominator = args.fps.num;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }
  if (!aom_img_alloc(&raw, args.img_fmt, info.frame_width, info.frame_height,
                     1)) {
    die("Failed to allocate image.");
  }
  if (!aom_img_alloc(&denoised, args.img_fmt, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image.");
  }
  infile = fopen(args.input, "rb");
  if (!infile) {
    die("Failed to open input file: %s", args.input);
  }
  fprintf(stderr, "Bit depth: %d  stride:%d\n", args.bit_depth, raw.stride[0]);

  const int high_bd = args.bit_depth > 8;
  const int block_size = args.block_size;
  aom_flat_block_finder_t block_finder;
  aom_flat_block_finder_init(&block_finder, block_size, args.bit_depth,
                             high_bd);

  const int num_blocks_w = (info.frame_width + block_size - 1) / block_size;
  const int num_blocks_h = (info.frame_height + block_size - 1) / block_size;
  uint8_t *flat_blocks = (uint8_t *)aom_malloc(num_blocks_w * num_blocks_h);
  if (!flat_blocks) die("Failed to allocate block data.");
  // Sets the random seed on the first entry in the output table
  int16_t random_seed = 7391;
  aom_noise_model_t noise_model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3, args.bit_depth,
                                      high_bd };
  aom_noise_model_init(&noise_model, params);

  FILE *denoised_file = 0;
  if (args.input_denoised) {
    denoised_file = fopen(args.input_denoised, "rb");
    if (!denoised_file)
      die("Unable to open input_denoised: %s", args.input_denoised);
  } else {
    die("--input-denoised file must be specified");
  }
  FILE *debug_file = 0;
  if (args.debug_file) {
    debug_file = fopen(args.debug_file, "w");
  }
  aom_film_grain_table_t grain_table = { 0, 0 };

  int64_t prev_timestamp = 0;
  int frame_count = 0;
  while (aom_img_read(&raw, infile)) {
    if (args.input_denoised) {
      if (!aom_img_read(&denoised, denoised_file)) {
        die("Unable to read input denoised file");
      }
    }
    if (frame_count % args.skip_frames == 0) {
      int num_flat_blocks = num_blocks_w * num_blocks_h;
      memset(flat_blocks, 1, num_flat_blocks);
      if (args.run_flat_block_finder) {
        memset(flat_blocks, 0, num_flat_blocks);
        num_flat_blocks = aom_flat_block_finder_run(
            &block_finder, raw.planes[0], info.frame_width, info.frame_height,
            info.frame_width, flat_blocks);
        fprintf(stdout, "Num flat blocks %d\n", num_flat_blocks);
      }

      const uint8_t *planes[3] = { raw.planes[0], raw.planes[1],
                                   raw.planes[2] };
      uint8_t *denoised_planes[3] = { denoised.planes[0], denoised.planes[1],
                                      denoised.planes[2] };
      int strides[3] = { raw.stride[0] >> high_bd, raw.stride[1] >> high_bd,
                         raw.stride[2] >> high_bd };
      int chroma_sub[3] = { raw.x_chroma_shift, raw.y_chroma_shift, 0 };

      fprintf(stdout, "Updating noise model...\n");
      aom_noise_status_t status = aom_noise_model_update(
          &noise_model, (const uint8_t *const *)planes,
          (const uint8_t *const *)denoised_planes, info.frame_width,
          info.frame_height, strides, chroma_sub, flat_blocks, block_size);

      int64_t cur_timestamp =
          frame_count * 10000000ULL * args.fps.den / args.fps.num;
      if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
        fprintf(stdout,
                "Noise type is different, updating parameters for time "
                "[ %" PRId64 ", %" PRId64 ")\n",
                prev_timestamp, cur_timestamp);
        aom_film_grain_t grain;
        aom_noise_model_get_grain_parameters(&noise_model, &grain);
        grain.random_seed = random_seed;
        random_seed = 0;
        aom_film_grain_table_append(&grain_table, prev_timestamp, cur_timestamp,
                                    &grain);
        aom_noise_model_save_latest(&noise_model);
        prev_timestamp = cur_timestamp;
      }
      if (debug_file) {
        print_debug_info(debug_file, &raw, &denoised, flat_blocks, block_size,
                         &noise_model);
      }
      fprintf(stdout, "Done noise model update, status = %d\n", status);
    }
    frame_count++;
  }

  aom_film_grain_t grain;
  aom_noise_model_get_grain_parameters(&noise_model, &grain);
  grain.random_seed = random_seed;
  aom_film_grain_table_append(&grain_table, prev_timestamp, INT64_MAX, &grain);
  if (args.output_grain_table) {
    struct aom_internal_error_info error_info;
    if (AOM_CODEC_OK != aom_film_grain_table_write(&grain_table,
                                                   args.output_grain_table,
                                                   &error_info)) {
      die("Unable to write output film grain table");
    }
  }
  aom_film_grain_table_free(&grain_table);

  if (infile) fclose(infile);
  if (denoised_file) fclose(denoised_file);
  if (debug_file) fclose(debug_file);
  aom_img_free(&raw);
  aom_img_free(&denoised);

  return EXIT_SUCCESS;
}